

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O3

void t3(void)

{
  int got;
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  
  puts("PWM/Servo pulse accuracy tests.");
  t3_val = 0x1167535;
  t3_reset = 1;
  lVar3 = 0;
  t3_count = 0;
  t3_tick = 0;
  t3_on = 0.0;
  t3_off = 0.0;
  gpioSetAlertFuncEx(0x19,t3cbf,&t3_val);
  iVar2 = 2;
  do {
    iVar1 = *(int *)((long)&DAT_00106ae0 + lVar3);
    gpioServo(0x19,iVar1);
    got = gpioGetServoPulsewidth(0x19);
    CHECK(3,iVar2 + -1,got,iVar1,0,"get servo pulsewidth");
    time_sleep(0x3ff0000000000000);
    t3_reset = 1;
    time_sleep(0x4010000000000000);
    CHECK(3,iVar2,(int)(((t3_off + t3_on) * 1000.0) / t3_on),(int)(20000000.0 / (double)iVar1),1,
          "set servo pulsewidth");
    lVar3 = lVar3 + 4;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0xc);
  lVar3 = 0;
  gpioServo(0x19,0);
  gpioSetPWMfrequency(0x19,1000);
  iVar2 = gpioGetPWMfrequency(0x19);
  CHECK(3,7,iVar2,1000,0,"set/get PWM frequency");
  iVar2 = gpioSetPWMrange(0x19,100);
  CHECK(3,8,iVar2,200,0,"set PWM range");
  piVar4 = &DAT_00106b30;
  do {
    iVar2 = *piVar4;
    gpioPWM(0x19,iVar2);
    iVar1 = gpioGetPWMdutycycle(0x19);
    CHECK(3,(uint)lVar3 | 9,iVar1,iVar2,0,"get PWM dutycycle");
    time_sleep(0x3ff0000000000000);
    t3_reset = 1;
    time_sleep(0x4000000000000000);
    CHECK(3,(uint)lVar3 + 10,(int)((t3_on * 1000.0) / (t3_on + t3_off)),iVar2 * 10,1,
          "set PWM dutycycle");
    piVar4 = piVar4 + 1;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 8);
  gpioPWM(0x19,0);
  return;
}

Assistant:

void t3()
{
   int f, rr;

   float on, off;

   int t, v;

   int pw[3]={500, 1500, 2500};
   int dc[4]={20, 40, 60, 80};

   printf("PWM/Servo pulse accuracy tests.\n");

   t3_val = USERDATA;
   t3_reset=1;
   t3_count=0;
   t3_tick=0;
   t3_on=0.0;
   t3_off=0.0;

   gpioSetAlertFuncEx(GPIO, t3cbf, &t3_val); /* test extended alert */

   for (t=0; t<3; t++)
   {
      gpioServo(GPIO, pw[t]);
      v = gpioGetServoPulsewidth(GPIO);
      CHECK(3, t+t+1, v, pw[t], 0, "get servo pulsewidth");

      time_sleep(1);
      t3_reset = 1;
      time_sleep(4);
      on = t3_on;
      off = t3_off;
      CHECK(3, t+t+2, (1E3*(on+off))/on, 2E7/pw[t], 1,
          "set servo pulsewidth");
   }

   gpioServo(GPIO, 0);
   gpioSetPWMfrequency(GPIO, 1000);
   f = gpioGetPWMfrequency(GPIO);
   CHECK(3, 7, f, 1000, 0, "set/get PWM frequency");

   rr = gpioSetPWMrange(GPIO, 100);
   CHECK(3, 8, rr, 200, 0, "set PWM range");

   for (t=0; t<4; t++)
   {
      gpioPWM(GPIO, dc[t]);
      v = gpioGetPWMdutycycle(GPIO);
      CHECK(3, t+t+9, v, dc[t], 0, "get PWM dutycycle");

      time_sleep(1);
      t3_reset = 1;
      time_sleep(2);
      on = t3_on;
      off = t3_off;
      CHECK(3, t+t+10, (1E3*on)/(on+off), 1E1*dc[t], 1,
         "set PWM dutycycle");
   }

   gpioPWM(GPIO, 0);
}